

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O1

bool __thiscall s2polyline_alignment::Window::IsValid(Window *this)

{
  int iVar1;
  int iVar2;
  pointer pCVar3;
  pointer pCVar4;
  bool bVar5;
  pointer pCVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  
  if ((((this->rows_ < 1) || (this->cols_ < 1)) ||
      (pCVar3 = (this->strides_).
                super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                ._M_impl.super__Vector_impl_data._M_start, pCVar3->start != 0)) ||
     (pCVar4 = (this->strides_).
               super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ._M_impl.super__Vector_impl_data._M_finish, pCVar4[-1].end != this->cols_)) {
    bVar9 = false;
  }
  else {
    bVar9 = pCVar3 == pCVar4;
    if (((!bVar9) && (iVar8 = pCVar3->end, -2 < iVar8)) &&
       ((iVar7 = pCVar3->start, iVar7 < iVar8 && (-2 < iVar7)))) {
      while( true ) {
        pCVar6 = pCVar3 + 1;
        bVar9 = pCVar6 == pCVar4;
        if ((bVar9) || (iVar1 = pCVar3[1].end, iVar1 < iVar8)) break;
        iVar2 = pCVar6->start;
        if (iVar1 <= iVar2) {
          return bVar9;
        }
        bVar5 = iVar2 < iVar7;
        iVar8 = iVar1;
        iVar7 = iVar2;
        pCVar3 = pCVar6;
        if (bVar5) {
          return bVar9;
        }
      }
    }
  }
  return bVar9;
}

Assistant:

bool Window::IsValid() const {
  if (rows_ <= 0 || cols_ <= 0 || strides_.front().start != 0 ||
      strides_.back().end != cols_) {
    return false;
  }

  ColumnStride prev = {-1, -1};
  for (const auto& curr : strides_) {
    if (curr.end <= curr.start || curr.start < prev.start ||
        curr.end < prev.end) {
      return false;
    }
    prev = curr;
  }
  return true;
}